

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicBuiltinVariables::RunIteration
          (BasicBuiltinVariables *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  GLuint *buffers;
  CallLogWrapper *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  int i;
  GLuint GVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ostream *poVar16;
  void *pvVar18;
  bool *compile_error;
  uint uVar19;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  uvec3 global_size;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  int local_208 [4];
  int local_1f8 [4];
  CallLogWrapper *local_1e8;
  ulong local_1e0;
  string local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  ulong uVar17;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  local_208[2] = 0;
  local_208[0] = 0;
  local_208[1] = 0;
  lVar15 = 0;
  do {
    local_208[lVar15] = num_groups->m_data[lVar15] * param_1->m_data[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),"\nlayout(local_size_x = ",0x17);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,", local_size_y = ",0x11);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,", local_size_z = ",0x11);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,") in;\nconst uvec3 kGlobalSize = uvec3(",0x26);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,", ",2);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,");\nlayout(std430) buffer OutputBuffer {\n  uvec4 num_work_groups[",0x40);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"];\n  uvec4 work_group_size[",0x1b);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,"];\n  uvec4 work_group_id[",0x19);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"];\n  uvec4 local_invocation_id[",0x1f);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"];\n  uvec4 global_invocation_id[",0x20);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"];\n  uvec4 local_invocation_index[",0x22);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,
             "];\n} g_out_buffer;\nvoid main() {\n  if ((gl_WorkGroupSize * gl_WorkGroupID + gl_LocalInvocationID) != gl_GlobalInvocationID) return;\n  uint global_index = gl_GlobalInvocationID.x +\n                      gl_GlobalInvocationID.y * kGlobalSize.x +\n                      gl_GlobalInvocationID.z * kGlobalSize.x * kGlobalSize.y;\n  g_out_buffer.num_work_groups[global_index] = uvec4(gl_NumWorkGroups, 0);\n  g_out_buffer.work_group_size[global_index] = uvec4(gl_WorkGroupSize, 0);\n  g_out_buffer.work_group_id[global_index] = uvec4(gl_WorkGroupID, 0);\n  g_out_buffer.local_invocation_id[global_index] = uvec4(gl_LocalInvocationID, 0);\n  g_out_buffer.global_invocation_id[global_index] = uvec4(gl_GlobalInvocationID, 0);\n  g_out_buffer.local_invocation_index[global_index] = uvec4(gl_LocalInvocationIndex);\n}"
             ,799);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  GVar12 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1d8);
  this->m_program = GVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar11 = ComputeShaderBase::CheckProgram
                     (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar11) {
    uVar13 = num_groups->m_data[0] * param_1->m_data[0] * param_1->m_data[1] * num_groups->m_data[1]
             * param_1->m_data[2] * num_groups->m_data[2];
    uVar17 = (ulong)uVar13;
    uVar14 = uVar13 * 2;
    local_1e0 = (ulong)(uVar13 * 6);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           local_1b8,local_1e0,(allocator_type *)&local_1d8);
    buffers = &this->m_storage_buffer;
    if (this->m_storage_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    }
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,uVar17 * 0x60,(void *)local_1b8._0_8_,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    if (dispatch_indirect) {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    }
    else {
      glu::CallLogWrapper::glDispatchCompute
                (this_00,num_groups->m_data[0],num_groups->m_data[1],num_groups->m_data[2]);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar18 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,uVar17 * 0x60,1);
    if (uVar13 != 0) {
      piVar21 = (int *)((long)pvVar18 + 0xc);
      uVar20 = 0;
      do {
        if ((((piVar21[-3] != num_groups->m_data[0]) || (piVar21[-2] != num_groups->m_data[1])) ||
            (piVar21[-1] != num_groups->m_data[2])) || (*piVar21 != 0)) {
          bVar11 = false;
          anon_unknown_0::Output("gl_NumWorkGroups: Invalid data at index %d.\n");
          goto LAB_00c26853;
        }
        uVar20 = uVar20 + 1;
        piVar21 = piVar21 + 4;
      } while (uVar17 != uVar20);
    }
    if (0 < (int)uVar13) {
      piVar21 = (int *)((long)pvVar18 + uVar17 * 0x10 + 0xc);
      uVar20 = uVar17;
      do {
        if (((piVar21[-3] != param_1->m_data[0]) || (piVar21[-2] != param_1->m_data[1])) ||
           ((piVar21[-1] != param_1->m_data[2] || (*piVar21 != 0)))) {
          bVar11 = false;
          anon_unknown_0::Output("gl_WorkGroupSize: Invalid data at index %d.\n");
          goto LAB_00c26853;
        }
        uVar19 = (int)uVar20 + 1;
        uVar20 = (ulong)uVar19;
        piVar21 = piVar21 + 4;
      } while (uVar19 < uVar14);
    }
    uVar19 = uVar13 * 3;
    local_1e8 = this_00;
    if (uVar14 < uVar19) {
      piVar21 = (int *)((long)pvVar18 + (ulong)uVar14 * 0x10 + 0xc);
      uVar20 = 0;
      do {
        uVar22 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar9 = (uVar20 & 0xffffffff) / uVar22;
        uVar7 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        bVar11 = false;
        if (((piVar21[-3] == (int)(((uVar20 & 0xffffffff) % uVar22) / (ulong)param_1->m_data[0])) &&
            (piVar21[-2] == (int)((uVar9 % uVar7) / (ulong)param_1->m_data[1]))) &&
           (piVar21[-1] == (int)((uVar9 / uVar7) / (ulong)param_1->m_data[2]))) {
          bVar11 = *piVar21 == 0;
        }
        if (!bVar11) {
          anon_unknown_0::Output("gl_WorkGroupID: Invalid data at index %d.\n",uVar14 + uVar20);
          goto LAB_00c2683f;
        }
        uVar20 = uVar20 + 1;
        piVar21 = piVar21 + 4;
      } while (uVar17 != uVar20);
    }
    uVar14 = uVar13 * 4;
    if (uVar19 < uVar14) {
      piVar21 = (int *)((long)pvVar18 + (ulong)uVar19 * 0x10 + 0xc);
      uVar20 = 0;
      do {
        uVar22 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar9 = (uVar20 & 0xffffffff) / uVar22;
        uVar7 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        bVar11 = false;
        if (((piVar21[-3] == (int)(((uVar20 & 0xffffffff) % uVar22) % (ulong)param_1->m_data[0])) &&
            (piVar21[-2] == (int)((uVar9 % uVar7) % (ulong)param_1->m_data[1]))) &&
           (piVar21[-1] == (int)((uVar9 / uVar7) % (ulong)param_1->m_data[2]))) {
          bVar11 = *piVar21 == 0;
        }
        if (!bVar11) {
          anon_unknown_0::Output
                    ("gl_LocalInvocationID: Invalid data at index %d.\n",uVar19 + uVar20);
          goto LAB_00c2683f;
        }
        uVar20 = uVar20 + 1;
        piVar21 = piVar21 + 4;
      } while (uVar17 != uVar20);
    }
    uVar19 = uVar13 * 5;
    if (uVar14 < uVar19) {
      piVar21 = (int *)((long)pvVar18 + (ulong)uVar14 * 0x10 + 0xc);
      uVar20 = 0;
      do {
        uVar22 = (ulong)(num_groups->m_data[0] * param_1->m_data[0]);
        uVar9 = (uVar20 & 0xffffffff) / uVar22;
        uVar7 = (ulong)(num_groups->m_data[1] * param_1->m_data[1]);
        bVar11 = false;
        if (((piVar21[-3] == (int)((uVar20 & 0xffffffff) % uVar22)) &&
            (piVar21[-2] == (int)(uVar9 % uVar7))) && (piVar21[-1] == (int)(uVar9 / uVar7))) {
          bVar11 = *piVar21 == 0;
        }
        if (!bVar11) {
          anon_unknown_0::Output
                    ("gl_GlobalInvocationID: Invalid data at index %d.\n",uVar14 + uVar20);
          goto LAB_00c2683f;
        }
        uVar20 = uVar20 + 1;
        piVar21 = piVar21 + 4;
      } while (uVar17 != uVar20);
    }
    if (uVar19 < (uint)local_1e0) {
      uVar20 = (ulong)uVar19;
      uVar22 = 0;
LAB_00c26740:
      lVar15 = (uVar20 + uVar22) * 0x10;
      iVar1 = *(int *)((long)pvVar18 + lVar15);
      iVar2 = *(int *)((long)pvVar18 + lVar15 + 4);
      iVar3 = *(int *)((long)pvVar18 + lVar15 + 8);
      iVar4 = *(int *)((long)pvVar18 + lVar15 + 0xc);
      uVar14 = param_1->m_data[0];
      uVar5 = param_1->m_data[1];
      uVar7 = (ulong)(num_groups->m_data[0] * uVar14);
      uVar8 = (ulong)(uVar19 + uVar13 * -5);
      uVar10 = uVar8 / uVar7;
      uVar9 = (ulong)(num_groups->m_data[1] * uVar5);
      uVar6 = param_1->m_data[2];
      lVar15 = 0;
      do {
        local_1f8[lVar15] =
             (int)((uVar8 % uVar7) % (ulong)uVar14) +
             ((int)((uVar10 % uVar9) % (ulong)uVar5) +
             (int)((uVar10 / uVar9) % (ulong)uVar6) * uVar5) * uVar14;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 4);
      bVar11 = false;
      if (((iVar1 == local_1f8[0]) && (iVar2 == local_1f8[1])) && (iVar3 == local_1f8[2])) {
        bVar11 = iVar4 == local_1f8[3];
      }
      if (bVar11) goto LAB_00c267f8;
      anon_unknown_0::Output("gl_LocalInvocationIndex: Invalid data at index %d.\n",(ulong)uVar19);
LAB_00c2683f:
      bVar11 = false;
      goto LAB_00c26853;
    }
LAB_00c26808:
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    bVar11 = true;
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
LAB_00c26853:
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ - local_1b8._0_8_);
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
LAB_00c267f8:
  uVar19 = uVar19 + 1;
  uVar22 = uVar22 + 1;
  if (uVar22 == uVar17) goto LAB_00c26808;
  goto LAB_00c26740;
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLuint kBufferSize =
			local_size.x() * num_groups.x() * local_size.y() * num_groups.y() * local_size.z() * num_groups.z();

		std::vector<uvec4> data(kBufferSize * 6);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kBufferSize * 6, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		uvec4* result;
		result = static_cast<uvec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(uvec4) * kBufferSize * 6, GL_MAP_READ_BIT));

		// gl_NumWorkGroups
		for (GLuint index = 0; index < kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(num_groups.x(), num_groups.y(), num_groups.z(), 0)))
			{
				Output("gl_NumWorkGroups: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupSize
		for (GLuint index = kBufferSize; index < 2 * kBufferSize; ++index)
		{
			if (!IsEqual(result[index], uvec4(local_size.x(), local_size.y(), local_size.z(), 0)))
			{
				Output("gl_WorkGroupSize: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_WorkGroupID
		for (GLuint index = 2 * kBufferSize; index < 3 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 2 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() /= local_size.x();
			expected.y() /= local_size.y();
			expected.z() /= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_WorkGroupID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationID
		for (GLuint index = 3 * kBufferSize; index < 4 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 3 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			expected.x() %= local_size.x();
			expected.y() %= local_size.y();
			expected.z() %= local_size.z();
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_LocalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_GlobalInvocationID
		for (GLuint index = 4 * kBufferSize; index < 5 * kBufferSize; ++index)
		{
			uvec3 expected = IndexTo3DCoord(index - 4 * kBufferSize, local_size.x() * num_groups.x(),
											local_size.y() * num_groups.y());
			if (!IsEqual(result[index], uvec4(expected.x(), expected.y(), expected.z(), 0)))
			{
				Output("gl_GlobalInvocationID: Invalid data at index %d.\n", index);
				return false;
			}
		}
		// gl_LocalInvocationIndex
		for (GLuint index = 5 * kBufferSize; index < 6 * kBufferSize; ++index)
		{
			uvec3 coord = IndexTo3DCoord(index - 5 * kBufferSize, local_size.x() * num_groups.x(),
										 local_size.y() * num_groups.y());
			const GLuint expected = (coord.x() % local_size.x()) + (coord.y() % local_size.y()) * local_size.x() +
									(coord.z() % local_size.z()) * local_size.x() * local_size.y();
			if (!IsEqual(result[index], uvec4(expected)))
			{
				Output("gl_LocalInvocationIndex: Invalid data at index %d.\n", index);
				return false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return true;
	}